

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,string *make,
          string *makefile,string *target,string *makeFlags)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_b8 [8];
  string makefileName_2;
  string *makefileName_1;
  string makefileName;
  string generator;
  string *makeFlags_local;
  string *target_local;
  string *makefile_local;
  string *make_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *command;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)make);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)makeFlags);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            ((undefined1 *)((long)&makefileName.field_2 + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&makefileName.field_2 + 8),"NMake Makefiles");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&makefileName.field_2 + 8),"NMake Makefiles JOM"), bVar1)) {
    cmSystemTools::ConvertToOutputPath((string *)&makefileName_1,makefile);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," /NOLOGO /f ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&makefileName_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
    std::__cxx11::string::~string((string *)&makefileName_1);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&makefileName.field_2 + 8),"MinGW Makefiles");
    if (bVar1) {
      makefileName_2.field_2._8_8_ = makefile;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -f \"");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)makefileName_2.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\" ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&makefileName.field_2 + 8),"Ninja");
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -v ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
      }
      else {
        cmSystemTools::ConvertToOutputPath((string *)local_b8,makefile);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," -f \"");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_b8);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\" ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," VERBOSE=1 ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)target);
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
  }
  std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target, const std::string& makeFlags)
{
  std::string command = make;
  if (!makeFlags.empty()) {
    command += " ";
    command += makeFlags;
  }

  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles" || generator == "NMake Makefiles JOM") {
    // For Windows ConvertToOutputPath already adds quotes when required.
    // These need to be escaped, see
    // https://gitlab.kitware.com/cmake/cmake/-/issues/13952
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " /NOLOGO /f ";
    command += makefileName;
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "MinGW Makefiles") {
    // no escaping of spaces in this case, see
    // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
    std::string const& makefileName = makefile;
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  } else if (generator == "Ninja") {
    command += " -v ";
    command += target;
  } else {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += " -f \"";
    command += makefileName;
    command += "\" ";
    command += " VERBOSE=1 ";
    command += target;
  }
  return command;
}